

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

bool __thiscall
google::
dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,Capital,SetKey<std::__cxx11::string,Capital>,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
::serialize<google::sparsehash_internal::pod_serializer<std::__cxx11::string>,StringIO>
          (void *param_1,StringIO *param_2)

{
  bool bVar1;
  size_type in_stack_00000008;
  int bit_1;
  int bit;
  uchar bits;
  size_type i;
  dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_000000a0;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar2;
  undefined4 in_stack_ffffffffffffffdc;
  uint uVar3;
  unsigned_long in_stack_ffffffffffffffe0;
  string *psVar4;
  bool local_1;
  
  dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(in_stack_000000a0);
  bVar1 = sparsehash_internal::write_bigendian_number<StringIO,unsigned_long>
                    (param_2,in_stack_ffffffffffffffe0,
                     CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (bVar1) {
    bVar1 = sparsehash_internal::write_bigendian_number<StringIO,unsigned_long>
                      (param_2,in_stack_ffffffffffffffe0,
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    if (bVar1) {
      bVar1 = sparsehash_internal::write_bigendian_number<StringIO,unsigned_long>
                        (param_2,in_stack_ffffffffffffffe0,
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      if (bVar1) {
        for (psVar4 = (string *)0x0; psVar4 < ((StringIO *)((long)param_1 + 0x90))->s_;
            psVar4 = (string *)&psVar4->_M_string_length) {
          uVar3 = 0;
          for (iVar2 = 0; iVar2 < 8; iVar2 = iVar2 + 1) {
            if (((string *)(&psVar4->_M_dataplus + iVar2) < ((StringIO *)((long)param_1 + 0x90))->s_
                ) && (bVar1 = dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                              ::test_empty(_bit,in_stack_00000008), !bVar1)) {
              uVar3 = (uint)(byte)((byte)(uVar3 >> 0x18) | (byte)(1 << ((byte)iVar2 & 0x1f))) <<
                      0x18;
            }
          }
          bVar1 = sparsehash_internal::write_data<StringIO>
                            ((StringIO *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),param_1,
                             0xfc3d40);
          if (!bVar1) {
            return false;
          }
          for (in_stack_ffffffffffffffd4 = 0; in_stack_ffffffffffffffd4 < 8;
              in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1) {
            if (((uVar3 >> 0x18 & 1 << ((byte)in_stack_ffffffffffffffd4 & 0x1f)) != 0) &&
               (bVar1 = sparsehash_internal::pod_serializer<std::__cxx11::string>::operator()
                                  ((pod_serializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                   (StringIO *)param_1,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)0xfc3da4), !bVar1)) {
              return false;
            }
          }
        }
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool serialize(ValueSerializer serializer, OUTPUT* fp) {
    squash_deleted();  // so we don't have to worry about delkey
    if (!sparsehash_internal::write_bigendian_number(fp, MAGIC_NUMBER, 4))
      return false;
    if (!sparsehash_internal::write_bigendian_number(fp, num_buckets, 8))
      return false;
    if (!sparsehash_internal::write_bigendian_number(fp, num_elements, 8))
      return false;
    // Now write a bitmap of non-empty buckets.
    for (size_type i = 0; i < num_buckets; i += 8) {
      unsigned char bits = 0;
      for (int bit = 0; bit < 8; ++bit) {
        if (i + bit < num_buckets && !test_empty(i + bit)) bits |= (1 << bit);
      }
      if (!sparsehash_internal::write_data(fp, &bits, sizeof(bits)))
        return false;
      for (int bit = 0; bit < 8; ++bit) {
        if (bits & (1 << bit)) {
          if (!serializer(fp, table[i + bit])) return false;
        }
      }
    }
    return true;
  }